

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall
QGraphicsScenePrivate::ungrabKeyboard
          (QGraphicsScenePrivate *this,QGraphicsItem *item,bool itemIsDying)

{
  QList<QGraphicsItem_*> *vector;
  QGraphicsItem **ppQVar1;
  long lVar2;
  QGraphicsItem *item_00;
  qsizetype qVar3;
  long in_FS_OFFSET;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 local_44;
  char *local_40;
  QGraphicsItem *item_local;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  vector = &this->keyboardGrabberItems;
  item_local = item;
  qVar3 = QtPrivate::lastIndexOf<QGraphicsItem*,QGraphicsItem*>(vector,&item_local,-1);
  if ((int)qVar3 == -1) {
    local_58 = 2;
    local_44 = 0;
    uStack_54 = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    uStack_48 = 0;
    local_40 = "default";
    QMessageLogger::warning
              ((char *)&local_58,"QGraphicsItem::ungrabKeyboard: not a keyboard grabber");
  }
  else {
    ppQVar1 = (this->keyboardGrabberItems).d.ptr;
    if (item_local != ppQVar1[(this->keyboardGrabberItems).d.size + -1]) {
      ungrabKeyboard(this,*(QGraphicsItem **)
                           ((long)ppQVar1 + ((qVar3 << 0x20) + 0x100000000 >> 0x1d)),itemIsDying);
    }
    if (itemIsDying) {
      QList<QGraphicsItem_*>::takeLast(vector);
    }
    else {
      local_58 = 0xaaaaaaaa;
      uStack_54 = 0xaaaaaaaa;
      uStack_50 = 0xaaaaaaaa;
      uStack_4c = 0xaaaaaaaa;
      QEvent::QEvent((QEvent *)&local_58,UngrabKeyboard);
      sendEvent(this,item_local,(QEvent *)&local_58);
      QEvent::~QEvent((QEvent *)&local_58);
      QList<QGraphicsItem_*>::takeLast(vector);
      lVar2 = (this->keyboardGrabberItems).d.size;
      if (lVar2 != 0) {
        item_00 = (this->keyboardGrabberItems).d.ptr[lVar2 + -1];
        local_58 = 0xaaaaaaaa;
        uStack_54 = 0xaaaaaaaa;
        uStack_50 = 0xaaaaaaaa;
        uStack_4c = 0xaaaaaaaa;
        QEvent::QEvent((QEvent *)&local_58,GrabKeyboard);
        sendEvent(this,item_00,(QEvent *)&local_58);
        QEvent::~QEvent((QEvent *)&local_58);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::ungrabKeyboard(QGraphicsItem *item, bool itemIsDying)
{
    int index = keyboardGrabberItems.lastIndexOf(item);
    if (index == -1) {
        qWarning("QGraphicsItem::ungrabKeyboard: not a keyboard grabber");
        return;
    }
    if (item != keyboardGrabberItems.constLast()) {
        // Recursively ungrab the topmost keyboard grabber until we reach this
        // item to ensure state consistency.
        ungrabKeyboard(keyboardGrabberItems.at(index + 1), itemIsDying);
    }

    // Send notification about keyboard ungrab.
    if (!itemIsDying) {
        QEvent event(QEvent::UngrabKeyboard);
        sendEvent(item, &event);
    }

    // Remove the item from the list of grabbers.
    keyboardGrabberItems.takeLast();

    // Send notification about mouse regrab.
    if (!itemIsDying && !keyboardGrabberItems.isEmpty()) {
        QGraphicsItem *last = keyboardGrabberItems.constLast();
        QEvent event(QEvent::GrabKeyboard);
        sendEvent(last, &event);
    }
}